

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

BufferWrapper * buffer_wrapped_lookup(ALuint name)

{
  byte bVar1;
  DeviceWrapper *local_30;
  uint8 hash;
  DeviceWrapper *device;
  BufferWrapper *retval;
  ALuint name_local;
  
  device = (DeviceWrapper *)0x0;
  if (current_context == (ContextWrapper *)0x0) {
    local_30 = (DeviceWrapper *)0x0;
  }
  else {
    local_30 = current_context->device;
  }
  if ((local_30 != (DeviceWrapper *)0x0) && (name != 0)) {
    bVar1 = hash_alname(name);
    for (device = (DeviceWrapper *)local_30->wrapped_buffer_hash[bVar1];
        (device != (DeviceWrapper *)0x0 && (*(ALuint *)&device->device != name));
        device = (DeviceWrapper *)device->wrapped_buffer_hash[0]) {
    }
  }
  return (BufferWrapper *)device;
}

Assistant:

static BufferWrapper *buffer_wrapped_lookup(const ALuint name)
{
    BufferWrapper *retval = NULL;
    DeviceWrapper *device = current_context ? current_context->device : NULL;
    if (device && name) {
        const uint8 hash = hash_alname(name);
        for (retval = device->wrapped_buffer_hash[hash]; retval; retval = retval->hash_next) {
            if (retval->name == name) {
                break;
            }
        }
    }
    return retval;


}